

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall bssl::der::Parser::ReadTag(Parser *this,CBS_ASN1_TAG tag,Input *out)

{
  bool bVar1;
  bool bVar2;
  CBS_ASN1_TAG actual_tag;
  Input value;
  CBS_ASN1_TAG local_3c;
  Input local_38;
  
  local_38.data_.data_ = (uchar *)0x0;
  local_38.data_.size_ = 0;
  bVar1 = PeekTagAndValue(this,&local_3c,&local_38);
  if (local_3c == tag && bVar1) {
    bVar2 = Advance(this);
    if (!bVar2) {
      abort();
    }
    (out->data_).data_ = local_38.data_.data_;
    (out->data_).size_ = local_38.data_.size_;
  }
  return local_3c == tag && bVar1;
}

Assistant:

bool Parser::ReadTag(CBS_ASN1_TAG tag, Input *out) {
  CBS_ASN1_TAG actual_tag;
  Input value;
  if (!PeekTagAndValue(&actual_tag, &value) || actual_tag != tag) {
    return false;
  }
  BSSL_CHECK(Advance());
  *out = value;
  return true;
}